

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O2

bool __thiscall internalJSONNode::IsEqualTo(internalJSONNode *this,internalJSONNode *val)

{
  uchar uVar1;
  uint uVar2;
  JSONNode **ppJVar3;
  JSONNode **ppJVar4;
  bool bVar5;
  __type _Var6;
  bool bVar7;
  long lVar8;
  double dVar9;
  
  if (this == val) {
    return true;
  }
  if ((this->_type == val->_type) && (bVar5 = std::operator!=(&this->_name,&val->_name), !bVar5)) {
    if (this->_type == '\0') {
      return true;
    }
    Fetch(this);
    Fetch(val);
    uVar1 = this->_type;
    if (uVar1 == '\x03') {
      return (val->_value)._bool == (this->_value)._bool;
    }
    if (uVar1 == '\x02') {
      dVar9 = (val->_value)._number - (this->_value)._number;
      if ((val->_value)._number <= (this->_value)._number) {
        return -1e-05 < dVar9;
      }
      return dVar9 < 1e-05;
    }
    if (uVar1 == '\x01') {
      _Var6 = std::operator==(&val->_string,&this->_string);
      return _Var6;
    }
    uVar2 = this->Children->mysize;
    if (uVar2 == val->Children->mysize) {
      ppJVar3 = val->Children->array;
      ppJVar4 = this->Children->array;
      lVar8 = 0;
      while( true ) {
        bVar5 = (ulong)uVar2 << 3 == lVar8;
        if (bVar5) {
          return bVar5;
        }
        bVar7 = ::JSONNode::operator!=
                          (*(JSONNode **)((long)ppJVar4 + lVar8),
                           *(JSONNode **)((long)ppJVar3 + lVar8));
        if (bVar7) break;
        lVar8 = lVar8 + 8;
      }
      return bVar5;
    }
  }
  return false;
}

Assistant:

bool internalJSONNode::IsEqualTo(const internalJSONNode * val) const json_nothrow {
    if (this == val) return true;  //same internal object, so they must be equal (not only for ref counting)
    if (type() != val -> type()) return false;	 //aren't even same type
    if (_name != val -> _name) return false;  //names aren't the same
    if (type() == JSON_NULL) return true;  //both null, can't be different
    #if !defined(JSON_PREPARSE) && defined(JSON_READ_PRIORITY) 
	   Fetch();
	   val -> Fetch();
    #endif 
    switch (type()){
	   case JSON_STRING:
		  return val -> _string == _string;
	   case JSON_NUMBER:
		  return _floatsAreEqual(val -> _value._number, _value._number);
	   case JSON_BOOL:
		  return val -> _value._bool == _value._bool;
    };

    JSON_ASSERT(type() == JSON_NODE || type() == JSON_ARRAY, JSON_TEXT("Checking for equality, not sure what type"));
    if (CHILDREN -> size() != val -> CHILDREN -> size()) return false;  //if they arne't he same size then they certainly aren't equal

    //make sure each children is the same
    JSONNode ** valrunner = val -> CHILDREN -> begin();
    json_foreach(CHILDREN, myrunner){
        JSON_ASSERT(*myrunner != NULL, json_global(ERROR_NULL_IN_CHILDREN));
		JSON_ASSERT(*valrunner != NULL, json_global(ERROR_NULL_IN_CHILDREN));
		JSON_ASSERT(valrunner != val -> CHILDREN -> end(), JSON_TEXT("at the end of other one's children, but they're the same size?"));
        if (**myrunner != **valrunner) return false;
		++valrunner;
    }
    return true;
}